

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise.cpp
# Opt level: O0

void __thiscall
ncnn::DeconvolutionDepthWise::cut_padding
          (DeconvolutionDepthWise *this,Mat *top_blob_bordered,Mat *top_blob,Option *opt)

{
  long in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  Mat *in_stack_00000008;
  Mat *in_stack_00000010;
  int hcut;
  int wcut;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int right;
  int left;
  
  left = (int)((ulong)in_RDI >> 0x20);
  right = (int)in_RDI;
  if ((((*(int *)(in_RDI + 0xec) < 1) && (*(int *)(in_RDI + 0xf0) < 1)) &&
      (*(int *)(in_RDI + 0xf4) < 1)) && (*(int *)(in_RDI + 0xf8) < 1)) {
    if ((*(int *)(in_RDI + 0x104) < 1) || (*(int *)(in_RDI + 0x108) < 1)) {
      ncnn::Mat::operator=
                ((Mat *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                 (Mat *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    }
    else if (((*(int *)(in_RDI + 0xec) == -0xe9) || (*(int *)(in_RDI + 0xf0) == -0xe9)) ||
            ((*(int *)(in_RDI + 0xf4) == -0xe9 || (*(int *)(in_RDI + 0xf8) == -0xe9)))) {
      copy_cut_border(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,left,right,
                      _hcut);
    }
    else if ((((*(int *)(in_RDI + 0xec) == -0xea) || (*(int *)(in_RDI + 0xf0) == -0xea)) ||
             (*(int *)(in_RDI + 0xf4) == -0xea)) || (*(int *)(in_RDI + 0xf8) == -0xea)) {
      copy_cut_border(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,left,right,
                      _hcut);
    }
  }
  else {
    copy_cut_border(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,left,right,
                    _hcut);
  }
  return;
}

Assistant:

void DeconvolutionDepthWise::cut_padding(const Mat& top_blob_bordered, Mat& top_blob, const Option& opt) const
{
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        copy_cut_border(top_blob_bordered, top_blob, pad_top, pad_bottom, pad_left, pad_right, opt);
    }
    else if (output_w > 0 && output_h > 0)
    {
        int wcut = top_blob_bordered.w - output_w;
        int hcut = top_blob_bordered.h - output_h;

        if (pad_left == -233 || pad_right == -233 || pad_top == -233 || pad_bottom == -233)
        {
            // onnx padding=SAME_UPPER
            copy_cut_border(top_blob_bordered, top_blob, hcut / 2, hcut - hcut / 2, wcut / 2, wcut - wcut / 2, opt);
        }
        else if (pad_left == -234 || pad_right == -234 || pad_top == -234 || pad_bottom == -234)
        {
            // onnx padding=SAME_LOWER
            copy_cut_border(top_blob_bordered, top_blob, hcut - hcut / 2, hcut / 2, wcut - wcut / 2, wcut / 2, opt);
        }
    }
    else
    {
        top_blob = top_blob_bordered;
    }
}